

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkDefaultCompatibility
          (CompatibilityChecker *this,Reader *value,Reader *replacement)

{
  uint uVar1;
  uint uVar2;
  undefined2 *puVar3;
  char cVar4;
  long lVar5;
  char cVar6;
  byte bVar7;
  short sVar8;
  long lVar9;
  int iVar10;
  short sVar11;
  int iVar12;
  char *condition;
  float fVar13;
  double dVar14;
  float fVar15;
  double dVar16;
  Fault f;
  Fault local_18;
  
  uVar1 = (value->_reader).dataSize;
  if (uVar1 < 0x10) {
    sVar8 = 0;
  }
  else {
    sVar8 = *(value->_reader).data;
  }
  uVar2 = (replacement->_reader).dataSize;
  if (uVar2 < 0x10) {
    sVar11 = 0;
  }
  else {
    sVar11 = *(replacement->_reader).data;
  }
  if (sVar8 == sVar11) {
    if (uVar1 < 0x10) {
      return;
    }
    puVar3 = (undefined2 *)(value->_reader).data;
    switch(*puVar3) {
    case 1:
      if (uVar1 == 0x10) {
        if (uVar2 < 0x11) {
          return;
        }
        bVar7 = 0;
LAB_0042e420:
        if (bVar7 == (*(byte *)((long)(replacement->_reader).data + 2) & 1)) {
          return;
        }
      }
      else {
        if (0x10 < uVar2) {
          bVar7 = *(byte *)(puVar3 + 1) & 1;
          goto LAB_0042e420;
        }
        if ((*(byte *)(puVar3 + 1) & 1) == 0) {
          return;
        }
      }
      condition = "value.getBool() == replacement.getBool()";
      iVar12 = 0x4af;
      break;
    case 2:
      if (uVar1 < 0x18) {
        cVar6 = '\0';
      }
      else {
        cVar6 = *(char *)(puVar3 + 1);
      }
      if (uVar2 < 0x18) {
        cVar4 = '\0';
      }
      else {
        cVar4 = *(char *)((long)(replacement->_reader).data + 2);
      }
      if (cVar6 == cVar4) {
        return;
      }
      condition = "value.getInt8() == replacement.getInt8()";
      iVar12 = 0x4b0;
      break;
    case 3:
      if (uVar1 < 0x20) {
        sVar8 = 0;
      }
      else {
        sVar8 = puVar3[1];
      }
      if (uVar2 < 0x20) {
        sVar11 = 0;
      }
      else {
        sVar11 = *(short *)((long)(replacement->_reader).data + 2);
      }
      if (sVar8 == sVar11) {
        return;
      }
      condition = "value.getInt16() == replacement.getInt16()";
      iVar12 = 0x4b1;
      break;
    case 4:
      iVar10 = 0;
      iVar12 = 0;
      if (0x3f < uVar1) {
        iVar12 = *(int *)(puVar3 + 2);
      }
      if (0x3f < uVar2) {
        iVar10 = *(int *)((long)(replacement->_reader).data + 4);
      }
      if (iVar12 == iVar10) {
        return;
      }
      condition = "value.getInt32() == replacement.getInt32()";
      iVar12 = 0x4b2;
      break;
    case 5:
      if (uVar1 < 0x80) {
        lVar9 = 0;
      }
      else {
        lVar9 = *(long *)(puVar3 + 4);
      }
      if (uVar2 < 0x80) {
        lVar5 = 0;
      }
      else {
        lVar5 = *(long *)((long)(replacement->_reader).data + 8);
      }
      if (lVar9 == lVar5) {
        return;
      }
      condition = "value.getInt64() == replacement.getInt64()";
      iVar12 = 0x4b3;
      break;
    case 6:
      if (uVar1 < 0x18) {
        cVar6 = '\0';
      }
      else {
        cVar6 = *(char *)(puVar3 + 1);
      }
      if (uVar2 < 0x18) {
        cVar4 = '\0';
      }
      else {
        cVar4 = *(char *)((long)(replacement->_reader).data + 2);
      }
      if (cVar6 == cVar4) {
        return;
      }
      condition = "value.getUint8() == replacement.getUint8()";
      iVar12 = 0x4b4;
      break;
    case 7:
      if (uVar1 < 0x20) {
        sVar8 = 0;
      }
      else {
        sVar8 = puVar3[1];
      }
      if (uVar2 < 0x20) {
        sVar11 = 0;
      }
      else {
        sVar11 = *(short *)((long)(replacement->_reader).data + 2);
      }
      if (sVar8 == sVar11) {
        return;
      }
      condition = "value.getUint16() == replacement.getUint16()";
      iVar12 = 0x4b5;
      break;
    case 8:
      iVar10 = 0;
      iVar12 = 0;
      if (0x3f < uVar1) {
        iVar12 = *(int *)(puVar3 + 2);
      }
      if (0x3f < uVar2) {
        iVar10 = *(int *)((long)(replacement->_reader).data + 4);
      }
      if (iVar12 == iVar10) {
        return;
      }
      condition = "value.getUint32() == replacement.getUint32()";
      iVar12 = 0x4b6;
      break;
    case 9:
      if (uVar1 < 0x80) {
        lVar9 = 0;
      }
      else {
        lVar9 = *(long *)(puVar3 + 4);
      }
      if (uVar2 < 0x80) {
        lVar5 = 0;
      }
      else {
        lVar5 = *(long *)((long)(replacement->_reader).data + 8);
      }
      if (lVar9 == lVar5) {
        return;
      }
      condition = "value.getUint64() == replacement.getUint64()";
      iVar12 = 0x4b7;
      break;
    case 10:
      fVar13 = 0.0;
      fVar15 = 0.0;
      if (0x3f < uVar1) {
        fVar15 = *(float *)(puVar3 + 2);
      }
      if (0x3f < uVar2) {
        fVar13 = *(float *)((long)(replacement->_reader).data + 4);
      }
      if ((fVar15 == fVar13) && (!NAN(fVar15) && !NAN(fVar13))) {
        return;
      }
      condition = "value.getFloat32() == replacement.getFloat32()";
      iVar12 = 0x4b8;
      break;
    case 0xb:
      dVar14 = 0.0;
      dVar16 = 0.0;
      if (0x7f < uVar1) {
        dVar16 = *(double *)(puVar3 + 4);
      }
      if (0x7f < uVar2) {
        dVar14 = *(double *)((long)(replacement->_reader).data + 8);
      }
      if ((dVar16 == dVar14) && (!NAN(dVar16) && !NAN(dVar14))) {
        return;
      }
      condition = "value.getFloat64() == replacement.getFloat64()";
      iVar12 = 0x4b9;
      break;
    default:
      goto switchD_0042e12d_caseD_c;
    case 0xf:
      if (uVar1 < 0x20) {
        sVar8 = 0;
      }
      else {
        sVar8 = puVar3[1];
      }
      if (uVar2 < 0x20) {
        sVar11 = 0;
      }
      else {
        sVar11 = *(short *)((long)(replacement->_reader).data + 2);
      }
      if (sVar8 == sVar11) {
        return;
      }
      condition = "value.getEnum() == replacement.getEnum()";
      iVar12 = 0x4ba;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,iVar12,FAILED,condition,"\"default value changed\"",
               (char (*) [22])"default value changed");
  }
  else {
    kj::_::Debug::Fault::Fault
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4a4,FAILED,"value.which() == replacement.which()","");
  }
  this->compatibility = INCOMPATIBLE;
  kj::_::Debug::Fault::~Fault(&local_18);
switchD_0042e12d_caseD_c:
  return;
}

Assistant:

void checkDefaultCompatibility(const schema::Value::Reader& value,
                                 const schema::Value::Reader& replacement) {
    // Note that we test default compatibility only after testing type compatibility, and default
    // values have already been validated as matching their types, so this should pass.
    KJ_ASSERT(value.which() == replacement.which()) {
      compatibility = INCOMPATIBLE;
      return;
    }

    switch (value.which()) {
#define HANDLE_TYPE(discrim, name) \
      case schema::Value::discrim: \
        VALIDATE_SCHEMA(value.get##name() == replacement.get##name(), "default value changed"); \
        break;
      HANDLE_TYPE(VOID, Void);
      HANDLE_TYPE(BOOL, Bool);
      HANDLE_TYPE(INT8, Int8);
      HANDLE_TYPE(INT16, Int16);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT8, Uint8);
      HANDLE_TYPE(UINT16, Uint16);
      HANDLE_TYPE(UINT32, Uint32);
      HANDLE_TYPE(UINT64, Uint64);
      HANDLE_TYPE(FLOAT32, Float32);
      HANDLE_TYPE(FLOAT64, Float64);
      HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

      case schema::Value::TEXT:
      case schema::Value::DATA:
      case schema::Value::LIST:
      case schema::Value::STRUCT:
      case schema::Value::INTERFACE:
      case schema::Value::ANY_POINTER:
        // It's not a big deal if default values for pointers change, and it would be difficult for
        // us to compare these defaults here, so just let it slide.
        break;
    }
  }